

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFHelper.h
# Opt level: O1

LineReader * __thiscall Assimp::DXF::LineReader::operator++(LineReader *this)

{
  char *pcVar1;
  pointer pcVar2;
  size_type sVar3;
  StreamReaderLE *pSVar4;
  Logger *this_00;
  char cVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  bool bVar9;
  char *local_1b8;
  char local_1a8 [16];
  undefined1 local_198 [376];
  
  if (this->end == 1) {
    iVar7 = 2;
  }
  else {
    if (this->end != 0) {
      return this;
    }
    pcVar1 = (this->splitter).mCur._M_dataplus._M_p;
    bVar9 = (*pcVar1 - 0x2bU & 0xfd) == 0;
    cVar5 = pcVar1[bVar9];
    iVar7 = 0;
    if (0xf5 < (byte)(cVar5 - 0x3aU)) {
      pcVar8 = pcVar1 + bVar9;
      iVar7 = 0;
      do {
        pcVar8 = pcVar8 + 1;
        iVar7 = (uint)(byte)(cVar5 - 0x30) + iVar7 * 10;
        cVar5 = *pcVar8;
      } while (0xf5 < (byte)(cVar5 - 0x3aU));
    }
    iVar6 = -iVar7;
    if (*pcVar1 != '-') {
      iVar6 = iVar7;
    }
    this->groupcode = iVar6;
    LineSplitter::operator++(&this->splitter);
    pcVar2 = (this->splitter).mCur._M_dataplus._M_p;
    local_198._0_8_ = local_198 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_198,pcVar2,pcVar2 + (this->splitter).mCur._M_string_length);
    std::__cxx11::string::operator=((string *)&this->value,(string *)local_198);
    if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
      operator_delete((void *)local_198._0_8_);
    }
    LineSplitter::operator++(&this->splitter);
    if (((this->value)._M_string_length != 0) && (*(this->value)._M_dataplus._M_p == '{')) {
      sVar3 = (this->splitter).mCur._M_string_length;
      while ((sVar3 != 0 && (*(this->splitter).mCur._M_dataplus._M_p != '}'))) {
        LineSplitter::operator++(&this->splitter);
        sVar3 = (this->splitter).mCur._M_string_length;
      }
      LineSplitter::operator++(&this->splitter);
      this_00 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[34]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
                 (char (*) [34])"DXF: skipped over control group (");
      std::ostream::_M_insert<unsigned_long>((ulong)local_198);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198," lines)",7);
      std::__cxx11::stringbuf::str();
      Logger::debug(this_00,local_1b8);
      if (local_1b8 != local_1a8) {
        operator_delete(local_1b8);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
      std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
    }
    pSVar4 = (this->splitter).mStream;
    if (*(int *)&pSVar4->end != *(int *)&pSVar4->current) {
      return this;
    }
    iVar7 = 1;
  }
  this->end = iVar7;
  return this;
}

Assistant:

LineReader& operator++() {
        if (end) {
            if (end == 1) {
                ++end;
            }
            return *this;
        }

        try {
            groupcode = strtol10(splitter->c_str());
            splitter++;

            value = *splitter;
            splitter++;

            // automatically skip over {} meta blocks (these are for application use
            // and currently not relevant for Assimp).
            if (value.length() && value[0] == '{') {

                size_t cnt = 0;
                for(;splitter->length() && splitter->at(0) != '}'; splitter++, cnt++);

                splitter++;
                ASSIMP_LOG_DEBUG((Formatter::format("DXF: skipped over control group ("),cnt," lines)"));
            }
        } catch(std::logic_error&) {
            ai_assert(!splitter);
        }
        if (!splitter) {
            end = 1;
        }
        return *this;
    }